

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O1

void __thiscall
soplex::CLUFactorRational::factor(CLUFactorRational *this,SVectorRational **vec,Rational *threshold)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  
  (*this->factorTime->_vptr_Timer[3])();
  this->stat = OK;
  *(this->l).start = 0;
  (this->l).firstUpdate = 0;
  (this->l).firstUnused = 0;
  iVar5 = this->thedim;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim(&(this->temp).s_max,iVar5,true);
  spx_realloc<int*>(&(this->temp).s_cact,iVar5);
  spx_realloc<int*>(&(this->temp).s_mark,iVar5);
  (this->temp).stage = 0;
  if (0 < this->thedim) {
    piVar1 = (this->col).perm;
    piVar2 = (this->col).orig;
    piVar3 = (this->row).orig;
    piVar4 = (this->row).perm;
    lVar6 = 0;
    do {
      piVar1[lVar6] = -1;
      piVar2[lVar6] = -1;
      piVar4[lVar6] = -1;
      piVar3[lVar6] = -1;
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->thedim);
  }
  initFactorMatrix(this,vec);
  if (this->stat != OK) goto LAB_00186e11;
  if (this->timeLimit < 0.0) {
LAB_00186d73:
    colSingletons(this);
    if (this->stat != OK) goto LAB_00186e11;
    if (0.0 <= this->timeLimit) {
      (*this->factorTime->_vptr_Timer[6])();
      if (this->timeLimit <= extraout_XMM0_Qa_00) goto LAB_00186e0b;
    }
    rowSingletons(this);
    if ((this->stat != OK) || (this->thedim <= (this->temp).stage)) goto LAB_00186e11;
    if (0.0 <= this->timeLimit) {
      (*this->factorTime->_vptr_Timer[6])();
      if (this->timeLimit <= extraout_XMM0_Qa_01) goto LAB_00186e0b;
    }
    initFactorRings(this);
    eliminateNucleus(this,threshold);
    freeFactorRings(this);
  }
  else {
    (*this->factorTime->_vptr_Timer[6])();
    if (extraout_XMM0_Qa < this->timeLimit) goto LAB_00186d73;
LAB_00186e0b:
    this->stat = TIME;
  }
LAB_00186e11:
  (this->l).firstUpdate = (this->l).firstUnused;
  if (this->stat == OK) {
    setupRowVals(this);
    iVar5 = setupColVals(this);
    this->nzCnt = iVar5;
  }
  (*this->factorTime->_vptr_Timer[4])();
  this->factorCount = this->factorCount + 1;
  return;
}

Assistant:

inline void CLUFactorRational::factor(
   const SVectorRational** vec,         ///< Array of column vector pointers
   const Rational& threshold            ///< pivoting threshold
)
{
   SPxOut::debug(this, "CLUFactorRational::factor()\n");

   factorTime->start();

   stat = SLinSolverRational::OK;

   l.start[0]    = 0;
   l.firstUpdate = 0;
   l.firstUnused = 0;

   temp.init(thedim);
   initPerm();

   initFactorMatrix(vec);

   if(stat)
      goto TERMINATE;

   if(timeLimitReached())
      goto TERMINATE;

   //   initMaxabs = initMaxabs;

   colSingletons();

   if(stat != SLinSolverRational::OK)
      goto TERMINATE;

   if(timeLimitReached())
      goto TERMINATE;

   rowSingletons();

   if(stat != SLinSolverRational::OK)
      goto TERMINATE;

   if(temp.stage < thedim)
   {
      if(timeLimitReached())
         goto TERMINATE;

      initFactorRings();
      eliminateNucleus(threshold);
      freeFactorRings();
   }

TERMINATE:

   l.firstUpdate = l.firstUnused;

   if(stat == SLinSolverRational::OK)
   {
#ifdef SOPLEX_WITH_L_ROWS
      setupRowVals();
#endif
      nzCnt = setupColVals();
   }

   factorTime->stop();

   factorCount++;
}